

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

void __thiscall
kj::ExternalMutexGuarded<kj::(anonymous_namespace)::OnlyTouchUnderLock>::~ExternalMutexGuarded
          (ExternalMutexGuarded<kj::(anonymous_namespace)::OnlyTouchUnderLock> *this)

{
  uint *puVar1;
  MutexGuarded<unsigned_int> *pMVar2;
  
  if (this->mutex != (Mutex *)0x0) {
    _::Mutex::lock();
    pMVar2 = (this->value).ptr;
    if (pMVar2 != (MutexGuarded<unsigned_int> *)0x0) {
      puVar1 = &pMVar2->value;
      *puVar1 = *puVar1 + 1;
    }
    (this->value).ptr = (MutexGuarded<unsigned_int> *)0x0;
    _::Mutex::unlock(this->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  pMVar2 = (this->value).ptr;
  if (pMVar2 != (MutexGuarded<unsigned_int> *)0x0) {
    puVar1 = &pMVar2->value;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

~ExternalMutexGuarded() noexcept(false) {
    if (mutex != nullptr) {
      mutex->lock(_::Mutex::EXCLUSIVE, kj::none, location);
      KJ_DEFER(mutex->unlock(_::Mutex::EXCLUSIVE));
      value = T();
    }
  }